

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O2

exr_result_t
exr_attr_opaquedata_copy(exr_context_t ctxt,exr_attr_opaquedata_t *ud,exr_attr_opaquedata_t *srcud)

{
  exr_result_t eVar1;
  int iVar2;
  
  if (srcud == (exr_attr_opaquedata_t *)0x0) {
    iVar2 = 3;
  }
  else {
    if (srcud->packed_data != (void *)0x0) {
      eVar1 = exr_attr_opaquedata_create(ctxt,ud,(long)srcud->size,srcud->packed_data);
      return eVar1;
    }
    iVar2 = exr_attr_opaquedata_init(ctxt,ud,0);
    if (iVar2 == 0) {
      eVar1 = exr_attr_opaquedata_set_unpacked(ctxt,ud,srcud->unpacked_data,srcud->unpacked_size);
      return eVar1;
    }
  }
  return iVar2;
}

Assistant:

exr_result_t
exr_attr_opaquedata_copy (
    exr_context_t                ctxt,
    exr_attr_opaquedata_t*       ud,
    const exr_attr_opaquedata_t* srcud)
{
    exr_result_t rv;
    if (!srcud) return EXR_ERR_INVALID_ARGUMENT;
    if (srcud->packed_data)
        return exr_attr_opaquedata_create (
            ctxt, ud, (size_t) srcud->size, srcud->packed_data);
    rv = exr_attr_opaquedata_init (ctxt, ud, 0);
    if (rv == EXR_ERR_SUCCESS)
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, ud, srcud->unpacked_data, srcud->unpacked_size);
    return rv;
}